

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

void __thiscall icu_63::NFRuleSet::~NFRuleSet(NFRuleSet *this)

{
  NFRule *this_00;
  void *in_RSI;
  int local_14;
  int i;
  NFRuleSet *this_local;
  
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    if ((((local_14 != 1) && (local_14 != 2)) && (local_14 != 3)) &&
       (this_00 = this->nonNumericalRules[local_14], this_00 != (NFRule *)0x0)) {
      NFRule::~NFRule(this_00);
      UMemory::operator_delete((UMemory *)this_00,in_RSI);
    }
  }
  NFRuleList::~NFRuleList(&this->fractionRules);
  NFRuleList::~NFRuleList(&this->rules);
  UnicodeString::~UnicodeString(&this->name);
  return;
}

Assistant:

NFRuleSet::~NFRuleSet()
{
    for (int i = 0; i < NON_NUMERICAL_RULE_LENGTH; i++) {
        if (i != IMPROPER_FRACTION_RULE_INDEX
            && i != PROPER_FRACTION_RULE_INDEX
            && i != MASTER_RULE_INDEX)
        {
            delete nonNumericalRules[i];
        }
        // else it will be deleted via NFRuleList fractionRules
    }
}